

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformAnyAll(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t uVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3d0;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar2 = Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsBoolScalarType(_,uVar2);
  this = inst_local;
  if (bVar1) {
    uVar2 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,local_20,3);
    bVar1 = ValidationState_t::IsBoolScalarType((ValidationState_t *)this,uVar2);
    if (bVar1) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_3d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3d0,(char (*) [40])"Predicate must be a boolean scalar type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d0);
    }
  }
  else {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,local_20);
    pDVar3 = DiagnosticStream::operator<<
                       (&local_1f8,(char (*) [37])"Result must be a boolean scalar type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformAnyAll(ValidationState_t& _,
                                           const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar type";
  }

  if (!_.IsBoolScalarType(_.GetOperandTypeId(inst, 3))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Predicate must be a boolean scalar type";
  }

  return SPV_SUCCESS;
}